

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_variable.cpp
# Opt level: O3

adios2_error adios2_selection_size(size_t *size,adios2_variable *variable)

{
  size_t sVar1;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"for adios2_variable, in call to adios2_selection_size","");
  adios2::helper::CheckForNullptr<adios2_variable_const>(variable,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  switch(*(undefined4 *)(variable + 0x28)) {
  case 1:
    __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                   &adios2::core::Variable<signed_char>::typeinfo,0);
    sVar1 = adios2::core::Variable<signed_char>::SelectionSize();
    break;
  case 2:
    __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                   &adios2::core::Variable<short>::typeinfo,0);
    sVar1 = adios2::core::Variable<short>::SelectionSize();
    break;
  case 3:
    __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                   &adios2::core::Variable<int>::typeinfo,0);
    sVar1 = adios2::core::Variable<int>::SelectionSize();
    break;
  case 4:
    __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                   &adios2::core::Variable<long>::typeinfo,0);
    sVar1 = adios2::core::Variable<long>::SelectionSize();
    break;
  case 5:
    __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                   &adios2::core::Variable<unsigned_char>::typeinfo,0);
    sVar1 = adios2::core::Variable<unsigned_char>::SelectionSize();
    break;
  case 6:
    __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                   &adios2::core::Variable<unsigned_short>::typeinfo,0);
    sVar1 = adios2::core::Variable<unsigned_short>::SelectionSize();
    break;
  case 7:
    __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                   &adios2::core::Variable<unsigned_int>::typeinfo,0);
    sVar1 = adios2::core::Variable<unsigned_int>::SelectionSize();
    break;
  case 8:
    __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                   &adios2::core::Variable<unsigned_long>::typeinfo,0);
    sVar1 = adios2::core::Variable<unsigned_long>::SelectionSize();
    break;
  case 9:
    __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                   &adios2::core::Variable<float>::typeinfo,0);
    sVar1 = adios2::core::Variable<float>::SelectionSize();
    break;
  case 10:
    __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                   &adios2::core::Variable<double>::typeinfo,0);
    sVar1 = adios2::core::Variable<double>::SelectionSize();
    break;
  case 0xb:
    __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                   &adios2::core::Variable<long_double>::typeinfo,0);
    sVar1 = adios2::core::Variable<long_double>::SelectionSize();
    break;
  case 0xc:
    __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                   &adios2::core::Variable<std::complex<float>>::typeinfo,0);
    sVar1 = adios2::core::Variable<std::complex<float>>::SelectionSize();
    break;
  case 0xd:
    __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                   &adios2::core::Variable<std::complex<double>>::typeinfo,0);
    sVar1 = adios2::core::Variable<std::complex<double>>::SelectionSize();
    break;
  case 0xe:
    __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                   &adios2::core::Variable<std::__cxx11::string>::typeinfo,0);
    sVar1 = adios2::core::Variable<std::__cxx11::string>::SelectionSize();
    break;
  case 0xf:
    __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                   &adios2::core::Variable<char>::typeinfo,0);
    sVar1 = adios2::core::Variable<char>::SelectionSize();
    break;
  default:
    goto switchD_001257a9_default;
  }
  *size = sVar1;
switchD_001257a9_default:
  return adios2_error_none;
}

Assistant:

adios2_error adios2_selection_size(size_t *size, const adios2_variable *variable)
{
    try
    {
        adios2::helper::CheckForNullptr(variable, "for adios2_variable, in call to "
                                                  "adios2_selection_size");
        const adios2::core::VariableBase *variableBase =
            reinterpret_cast<const adios2::core::VariableBase *>(variable);

        const adios2::DataType typeCpp = variableBase->m_Type;

        if (typeCpp == adios2::DataType::Struct)
        {
            // not supported
        }
#define declare_template_instantiation(T)                                                          \
    else if (typeCpp == adios2::helper::GetDataType<T>())                                          \
    {                                                                                              \
        const adios2::core::Variable<T> *variable =                                                \
            dynamic_cast<const adios2::core::Variable<T> *>(variableBase);                         \
        *size = variable->SelectionSize();                                                         \
    }
        ADIOS2_FOREACH_STDTYPE_1ARG(declare_template_instantiation)
#undef declare_template_instantiation

        return adios2_error_none;
    }
    catch (...)
    {
        return static_cast<adios2_error>(adios2::helper::ExceptionToError("adios2_selection_size"));
    }
}